

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_order.c
# Opt level: O3

void rhash_swap_copy_str_to_u32(void *to,int index,void *from,size_t length)

{
  undefined1 uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint *puVar5;
  long lVar6;
  uint *puVar7;
  
  uVar3 = (ulong)index;
  if (((index | (uint)length | (uint)to | (uint)from) & 3) == 0) {
    if (0 < (long)length) {
      puVar5 = (uint *)(length + (long)from);
      puVar7 = (uint *)((long)to + uVar3);
      do {
        uVar2 = *from;
        *puVar7 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        puVar7 = puVar7 + 1;
        from = (void *)((long)from + 4);
      } while (from < puVar5);
    }
  }
  else {
    uVar4 = length + uVar3;
    if (uVar3 < uVar4) {
      lVar6 = uVar3 << 0x20;
      do {
        uVar1 = *from;
        from = (void *)((long)from + 1);
        *(undefined1 *)((long)to + (lVar6 >> 0x20 ^ 3U)) = uVar1;
        uVar3 = uVar3 + 1;
        lVar6 = lVar6 + 0x100000000;
      } while (uVar3 < uVar4);
    }
  }
  return;
}

Assistant:

void rhash_swap_copy_str_to_u32(void* to, int index, const void* from, size_t length)
{
	/* if all pointers and length are 32-bits aligned */
	if ( 0 == (( (int)((char*)to - (char*)0) | ((char*)from - (char*)0) | index | length ) & 3) ) {
		/* copy memory as 32-bit words */
		const uint32_t* src = (const uint32_t*)from;
		const uint32_t* end = (const uint32_t*)((const char*)src + length);
		uint32_t* dst = (uint32_t*)((char*)to + index);
		for (; src < end; dst++, src++)
			*dst = bswap_32(*src);
	} else {
		const char* src = (const char*)from;
		for (length += index; (size_t)index < length; index++)
			((char*)to)[index ^ 3] = *(src++);
	}
}